

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver.cc
# Opt level: O2

void __thiscall mp::NLFeeder_Easy::ExportPreproData(NLFeeder_Easy *this,PreprocessData *pd)

{
  pointer piVar1;
  pointer ppVar2;
  pointer piVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  
  std::vector<int,_std::allocator<int>_>::resize(&pd->vperm_,(long)(this->nlme_).vars_.num_col_);
  std::vector<int,_std::allocator<int>_>::resize(&pd->vperm_inv_,(long)(this->nlme_).vars_.num_col_)
  ;
  piVar1 = (pd->vperm_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar4 = (long)(pd->vperm_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar1;
  lVar5 = lVar4 >> 2;
  ppVar2 = (this->var_perm_).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar3 = (pd->vperm_inv_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar4 = lVar4 * 0x40000000;
  while( true ) {
    lVar4 = lVar4 + -0x100000000;
    bVar6 = lVar5 == 0;
    lVar5 = lVar5 + -1;
    if (bVar6) break;
    piVar1[lVar5] = *(int *)((long)&ppVar2->first + (lVar4 >> 0x1d));
    piVar3[lVar5] = *(int *)((long)&ppVar2->second + (lVar4 >> 0x1d));
  }
  return;
}

Assistant:

void ExportPreproData(NLModel::PreprocessData &pd) {
    pd.vperm_.resize(NLME().NumCols());
    pd.vperm_inv_.resize(NLME().NumCols());
    for (auto i=pd.vperm_.size(); i--; ) {
      pd.vperm_[i] = VPerm(i);
      pd.vperm_inv_[i] = VPermInv(i);
    }
  }